

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
* anon_unknown.dwarf_33386e4::ParsePubkey
            (uint32_t key_exp_index,Span<const_char> *sp,ParseScriptContext ctx,
            FlatSigningProvider *out,string *error)

{
  long lVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  string_view str;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  string_view hex_str;
  bool bVar2;
  undefined1 uVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  uint *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  iterator __x;
  reference __args_00;
  undefined4 in_ECX;
  undefined4 in_ESI;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *in_RDI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  Span<const_char> SVar7;
  __sv_type _Var8;
  uint32_t in_stack_00000074;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *prov;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  providers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fpr_bytes;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> slash_split;
  bool apostrophe;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> origin_split;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ret;
  KeyOriginInfo info;
  string fpr_hex;
  string *in_stack_00000310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  allocator<char> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined7 in_stack_fffffffffffffdb8;
  undefined7 uVar9;
  char in_stack_fffffffffffffdbf;
  undefined1 uVar10;
  undefined7 in_stack_fffffffffffffdc0;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this_00;
  KeyOriginInfo *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *__s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  undefined1 in_stack_fffffffffffffe4f;
  string *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe68;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_150;
  undefined1 local_138 [31];
  allocator<char> local_119;
  size_t local_118;
  undefined1 in_stack_fffffffffffffef0 [16];
  ParseScriptContext in_stack_ffffffffffffff04;
  Span<const_char> *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = in_RDI;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            *)in_stack_fffffffffffffd88);
  util::Split<Span<char_const>>
            ((Span<const_char> *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             in_stack_fffffffffffffdbf);
  sVar4 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     in_stack_fffffffffffffd88);
  if (sVar4 < 3) {
    sVar4 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                      ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                       in_stack_fffffffffffffd88);
    if (sVar4 == 1) {
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (size_type)in_stack_fffffffffffffd90);
      ParsePubkeyInner(in_stack_00000074,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                       (FlatSigningProvider *)in_stack_fffffffffffffef0._8_8_,
                       in_stack_fffffffffffffef0._0_8_,in_stack_00000310);
      in_ESI = in_stack_fffffffffffffd9c;
    }
    else {
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (size_type)in_stack_fffffffffffffd90);
      bVar2 = Span<const_char>::empty((Span<const_char> *)in_stack_fffffffffffffd88);
      if (!bVar2) {
        std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                  ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (size_type)in_stack_fffffffffffffd90);
        pcVar5 = Span<const_char>::operator[]
                           ((Span<const_char> *)
                            CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                            (size_t)in_stack_fffffffffffffd90);
        if (*pcVar5 == '[') {
          std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     (size_type)in_stack_fffffffffffffd90);
          SVar7 = Span<const_char>::subspan
                            ((Span<const_char> *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (size_t)in_stack_fffffffffffffd90);
          util::Split<Span<char_const>>
                    ((Span<const_char> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffdbf);
          std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     (size_type)in_stack_fffffffffffffd90);
          sVar6 = Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffffd88);
          if (sVar6 == 8) {
            __args_1 = (KeyOriginInfo *)0x0;
            this_00 = (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                       *)&stack0xffffffffffffff00;
            std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                      ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                       CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       (size_type)in_stack_fffffffffffffd90);
            __args = (uint *)Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffd88);
            std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                      ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                       CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       (size_type)in_stack_fffffffffffffd90);
            __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffd88);
            this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_119;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<char_const*,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                       (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                       (char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
            std::allocator<char>::~allocator(&local_119);
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffda8);
            str._M_len._7_1_ = in_stack_fffffffffffffdb7;
            str._M_len._0_7_ = in_stack_fffffffffffffdb0;
            str._M_str._0_7_ = in_stack_fffffffffffffdb8;
            str._M_str._7_1_ = in_stack_fffffffffffffdbf;
            uVar3 = IsHex(str);
            if ((bool)uVar3) {
              _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffda8);
              this_02 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)_Var8._M_len;
              hex_str._M_len._4_4_ = in_stack_fffffffffffffdf4;
              hex_str._M_len._0_4_ = in_stack_fffffffffffffdf0;
              hex_str._M_str = (char *)__s;
              ParseHex<unsigned_char>(hex_str);
              KeyOriginInfo::KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffd88);
              sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffd88);
              if (sVar4 != 4) {
                __assert_fail("fpr_bytes.size() == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                              ,0x653,
                              "std::vector<std::unique_ptr<PubkeyProvider>> (anonymous namespace)::ParsePubkey(uint32_t, const Span<const char> &, ParseScriptContext, FlatSigningProvider &, std::string &)"
                             );
              }
              uVar9 = SUB87(local_138,0);
              uVar10 = (undefined1)((ulong)local_138 >> 0x38);
              __x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffd90);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffd90);
              __first._M_current._7_1_ = uVar10;
              __first._M_current._0_7_ = uVar9;
              __last._M_current._7_1_ = in_stack_fffffffffffffdb7;
              __last._M_current._0_7_ = in_stack_fffffffffffffdb0;
              std::
              copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                        (__first,__last,
                         (uchar *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
              this = &local_150;
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)in_stack_fffffffffffffd88);
              bVar2 = ParseKeyPath((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                                   CONCAT44(in_ECX,in_stack_fffffffffffffe68),in_R8,(bool *)in_R9,
                                   in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
              if (bVar2) {
                __args_00 = std::
                            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                                 (size_type)in_stack_fffffffffffffd90);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (this_02,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   __x._M_current);
                in_stack_fffffffffffffd88 = in_R9;
                std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                          ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                           CONCAT44(in_ESI,in_stack_fffffffffffffd98),
                           (size_type)in_stack_fffffffffffffd90);
                ParsePubkeyInner(in_stack_00000074,in_stack_ffffffffffffff08,
                                 in_stack_ffffffffffffff04,(FlatSigningProvider *)SVar7.m_size,
                                 (bool *)SVar7.m_data,in_stack_00000310);
                bVar2 = std::
                        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ::empty((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                 *)CONCAT44(in_ESI,in_stack_fffffffffffffd98));
                if (bVar2) {
                  memset(__s,0,0x18);
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                            *)in_stack_fffffffffffffd88);
                }
                else {
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::size((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                          *)in_stack_fffffffffffffd88);
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::reserve(this_00,CONCAT17(uVar3,in_stack_fffffffffffffdc0));
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::begin(in_stack_fffffffffffffd90);
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::end(in_stack_fffffffffffffd90);
                  while (bVar2 = __gnu_cxx::
                                 operator==<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                                           ((__normal_iterator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                                             *)CONCAT44(in_ESI,in_stack_fffffffffffffd98),
                                            (__normal_iterator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                                             *)in_stack_fffffffffffffd90),
                        ((bVar2 ^ 0xffU) & 1) != 0) {
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                    ::operator*((__normal_iterator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                                 *)in_stack_fffffffffffffd88);
                    std::
                    make_unique<(anonymous_namespace)::OriginPubkeyProvider,unsigned_int&,KeyOriginInfo&,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,bool&>
                              (__args,__args_1,
                               (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                                *)this_00,(bool *)CONCAT17(uVar3,in_stack_fffffffffffffdc0));
                    std::
                    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                    ::
                    emplace_back<std::unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>>>
                              (this,(unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                                     *)__args_00);
                    std::
                    unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                    ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                                   *)CONCAT44(in_ESI,in_stack_fffffffffffffd98));
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                    ::operator++((__normal_iterator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>
                                  *)in_stack_fffffffffffffd88);
                  }
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                            *)in_stack_fffffffffffffd88,
                           (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                            *)0x19d8b5a);
                }
                std::
                vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                           *)CONCAT44(in_ESI,in_stack_fffffffffffffd98));
              }
              else {
                memset(__s,0,0x18);
                std::
                vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                          *)in_stack_fffffffffffffd88);
                in_ESI = in_stack_fffffffffffffd9c;
              }
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)CONCAT44(in_ESI,in_stack_fffffffffffffd98));
              KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffd88);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_ESI,in_stack_fffffffffffffd98));
            }
            else {
              tinyformat::format<std::__cxx11::string>
                        ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(this_01,__str);
              std::__cxx11::string::~string(in_stack_fffffffffffffd88);
              memset(__s,0,0x18);
              std::
              vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        *)in_stack_fffffffffffffd88);
              in_ESI = in_stack_fffffffffffffd9c;
            }
            std::__cxx11::string::~string(in_stack_fffffffffffffd88);
          }
          else {
            std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                      ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                       CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       (size_type)in_stack_fffffffffffffd90);
            local_118 = Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffffd88);
            tinyformat::format<unsigned_long>
                      ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
            std::__cxx11::string::~string(in_stack_fffffffffffffd88);
            memset(__s,0,0x18);
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      *)in_stack_fffffffffffffd88);
            in_ESI = in_stack_fffffffffffffd9c;
          }
          std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::~vector
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     CONCAT44(in_ESI,in_stack_fffffffffffffd98));
          goto LAB_019d8c11;
        }
      }
      in_ESI = in_stack_fffffffffffffd9c;
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 CONCAT44(in_ESI,in_stack_fffffffffffffd98),(size_type)in_stack_fffffffffffffd90);
      bVar2 = Span<const_char>::empty((Span<const_char> *)in_stack_fffffffffffffd88);
      if (!bVar2) {
        std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                  ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                   CONCAT44(in_ESI,in_stack_fffffffffffffd98),(size_type)in_stack_fffffffffffffd90);
        Span<const_char>::operator[]
                  ((Span<const_char> *)CONCAT44(in_ESI,in_stack_fffffffffffffd98),
                   (size_t)in_stack_fffffffffffffd90);
      }
      tinyformat::format<char>
                ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                 (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(in_stack_fffffffffffffd88);
      memset(__s,0,0x18);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                *)in_stack_fffffffffffffd88);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (char *)in_stack_fffffffffffffd90);
    memset(__s,0,0x18);
    std::
    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              *)in_stack_fffffffffffffd88);
    in_ESI = in_stack_fffffffffffffd9c;
  }
LAB_019d8c11:
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::~vector
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffd98));
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             *)CONCAT44(in_ESI,in_stack_fffffffffffffd98));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<std::unique_ptr<PubkeyProvider>> ParsePubkey(uint32_t key_exp_index, const Span<const char>& sp, ParseScriptContext ctx, FlatSigningProvider& out, std::string& error)
{
    std::vector<std::unique_ptr<PubkeyProvider>> ret;
    auto origin_split = Split(sp, ']');
    if (origin_split.size() > 2) {
        error = "Multiple ']' characters found for a single pubkey";
        return {};
    }
    // This is set if either the origin or path suffix contains a hardened derivation.
    bool apostrophe = false;
    if (origin_split.size() == 1) {
        return ParsePubkeyInner(key_exp_index, origin_split[0], ctx, out, apostrophe, error);
    }
    if (origin_split[0].empty() || origin_split[0][0] != '[') {
        error = strprintf("Key origin start '[ character expected but not found, got '%c' instead",
                          origin_split[0].empty() ? /** empty, implies split char */ ']' : origin_split[0][0]);
        return {};
    }
    auto slash_split = Split(origin_split[0].subspan(1), '/');
    if (slash_split[0].size() != 8) {
        error = strprintf("Fingerprint is not 4 bytes (%u characters instead of 8 characters)", slash_split[0].size());
        return {};
    }
    std::string fpr_hex = std::string(slash_split[0].begin(), slash_split[0].end());
    if (!IsHex(fpr_hex)) {
        error = strprintf("Fingerprint '%s' is not hex", fpr_hex);
        return {};
    }
    auto fpr_bytes = ParseHex(fpr_hex);
    KeyOriginInfo info;
    static_assert(sizeof(info.fingerprint) == 4, "Fingerprint must be 4 bytes");
    assert(fpr_bytes.size() == 4);
    std::copy(fpr_bytes.begin(), fpr_bytes.end(), info.fingerprint);
    std::vector<KeyPath> path;
    if (!ParseKeyPath(slash_split, path, apostrophe, error, /*allow_multipath=*/false)) return {};
    info.path = path.at(0);
    auto providers = ParsePubkeyInner(key_exp_index, origin_split[1], ctx, out, apostrophe, error);
    if (providers.empty()) return {};
    ret.reserve(providers.size());
    for (auto& prov : providers) {
        ret.emplace_back(std::make_unique<OriginPubkeyProvider>(key_exp_index, info, std::move(prov), apostrophe));
    }
    return ret;
}